

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O3

uint16_t __thiscall icu_63::Normalizer2Impl::nextFCD16(Normalizer2Impl *this,UChar **s,UChar *limit)

{
  UChar *pUVar1;
  UChar UVar2;
  UChar *pUVar3;
  uint16_t uVar4;
  uint c;
  
  pUVar3 = *s;
  pUVar1 = pUVar3 + 1;
  *s = pUVar1;
  UVar2 = *pUVar3;
  c = (uint)(ushort)UVar2;
  if ((ushort)this->minDecompNoCP <= (ushort)UVar2) {
    if ((this->smallFCD[(ushort)UVar2 >> 8] != 0) &&
       ((ushort)((ushort)(1 << ((byte)UVar2 >> 5)) & (ushort)this->smallFCD[(ushort)UVar2 >> 8]) !=
        0)) {
      if ((pUVar1 != limit && (UVar2 & 0xfc00U) == 0xd800) && (((ushort)*pUVar1 & 0xfc00) == 0xdc00)
         ) {
        c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar1 + 0xfca02400;
        *s = pUVar3 + 2;
      }
      uVar4 = getFCD16FromNormData(this,c);
      return uVar4;
    }
  }
  return 0;
}

Assistant:

uint16_t nextFCD16(const UChar *&s, const UChar *limit) const {
        UChar32 c=*s++;
        if(c<minDecompNoCP || !singleLeadMightHaveNonZeroFCD16(c)) {
            return 0;
        }
        UChar c2;
        if(U16_IS_LEAD(c) && s!=limit && U16_IS_TRAIL(c2=*s)) {
            c=U16_GET_SUPPLEMENTARY(c, c2);
            ++s;
        }
        return getFCD16FromNormData(c);
    }